

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  undefined1 uVar1;
  undefined4 uVar2;
  _Base_ptr p_Var3;
  CppType CVar4;
  iterator iVar5;
  LogMessage *pLVar6;
  _Base_ptr p_Var7;
  LogFinisher local_5d;
  int number_local;
  LogMessage local_58;
  
  number_local = number;
  iVar5 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                  *)this,&number_local);
  if ((_Rb_tree_header *)iVar5._M_node == &(this->extensions_)._M_t._M_impl.super__Rb_tree_header) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x336);
    pLVar6 = LogMessage::operator<<(&local_58,"CHECK failed: iter != extensions_.end(): ");
    pLVar6 = LogMessage::operator<<(pLVar6,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_5d,pLVar6);
    LogMessage::~LogMessage(&local_58);
  }
  if (*(char *)((long)&iVar5._M_node[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x339);
    pLVar6 = LogMessage::operator<<(&local_58,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_5d,pLVar6);
    LogMessage::~LogMessage(&local_58);
  }
  CVar4 = anon_unknown_29::cpp_type(*(FieldType *)&iVar5._M_node[1]._M_left);
  switch(CVar4) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
  case CPPTYPE_ENUM:
    p_Var7 = (iVar5._M_node[1]._M_parent)->_M_parent;
    uVar2 = *(undefined4 *)((long)&p_Var7->_M_parent + (long)index1 * 4);
    *(undefined4 *)((long)&p_Var7->_M_parent + (long)index1 * 4) =
         *(undefined4 *)((long)&p_Var7->_M_parent + (long)index2 * 4);
    *(undefined4 *)((long)&p_Var7->_M_parent + (long)index2 * 4) = uVar2;
    break;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
    p_Var7 = (iVar5._M_node[1]._M_parent)->_M_parent;
    goto LAB_0033d1b1;
  case CPPTYPE_DOUBLE:
    p_Var3 = (iVar5._M_node[1]._M_parent)->_M_parent;
    p_Var7 = (&p_Var3->_M_parent)[index1];
    (&p_Var3->_M_parent)[index1] = (&p_Var3->_M_parent)[index2];
    (&p_Var3->_M_parent)[index2] = p_Var7;
    break;
  case CPPTYPE_FLOAT:
    p_Var7 = (iVar5._M_node[1]._M_parent)->_M_parent;
    uVar2 = *(undefined4 *)((long)&p_Var7->_M_parent + (long)index1 * 4);
    *(undefined4 *)((long)&p_Var7->_M_parent + (long)index1 * 4) =
         *(undefined4 *)((long)&p_Var7->_M_parent + (long)index2 * 4);
    *(undefined4 *)((long)&p_Var7->_M_parent + (long)index2 * 4) = uVar2;
    break;
  case CPPTYPE_BOOL:
    p_Var7 = (iVar5._M_node[1]._M_parent)->_M_parent;
    uVar1 = *(undefined1 *)((long)&p_Var7->_M_parent + (long)index1);
    *(undefined1 *)((long)&p_Var7->_M_parent + (long)index1) =
         *(undefined1 *)((long)&p_Var7->_M_parent + (long)index2);
    *(undefined1 *)((long)&p_Var7->_M_parent + (long)index2) = uVar1;
    break;
  case CPPTYPE_STRING:
  case CPPTYPE_MESSAGE:
    p_Var7 = (iVar5._M_node[1]._M_parent)->_M_left;
LAB_0033d1b1:
    p_Var3 = (&p_Var7->_M_parent)[index1];
    (&p_Var7->_M_parent)[index1] = (&p_Var7->_M_parent)[index2];
    (&p_Var7->_M_parent)[index2] = p_Var3;
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  ExtensionMap::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";

  Extension* extension = &iter->second;
  GOOGLE_DCHECK(extension->is_repeated);

  switch(cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->SwapElements(index1, index2);
      break;
  }
}